

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall libchars::commands::auto_complete(commands *this)

{
  value_type *__x;
  string *this_00;
  size_t *this_01;
  token *ptVar1;
  double dVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  _Self __tmp_1;
  debug *pdVar7;
  token *ptVar8;
  token *search;
  char *pcVar9;
  undefined1 auVar10 [8];
  char *pcVar11;
  _List_node_base *p_Var12;
  _Self __tmp;
  token **pptVar13;
  _List_node_base *p_Var14;
  pointer pcVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined1 local_1d8 [8];
  command_cursor cw;
  undefined1 local_130 [8];
  command_cursor ci;
  size_type *local_a0;
  string available_str;
  string prefix;
  size_t local_58;
  size_t t_offset;
  undefined1 local_48 [8];
  string_list_t options;
  
  pdVar7 = debug::initialize(0);
  debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  t_offset = (size_t)&this->t_cmd;
  ci.idx = (size_t)&this->root;
  do {
    if ((this->super_edit_object).insert_idx < (this->super_edit_object).buflen) {
      return;
    }
    local_58 = 0;
    ptVar8 = find_current_token(this,&local_58);
    pdVar7 = debug::initialize(0);
    sVar3 = local_58;
    if (ptVar8 == (token *)0x0) {
      debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    }
    else {
      debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if (sVar3 < ptVar8->length) {
        return;
      }
      if ((ptVar8->status & 0x400) != 0) {
        return;
      }
    }
    local_a0 = &available_str._M_string_length;
    available_str._M_dataplus._M_p = (pointer)0x0;
    available_str._M_string_length._0_1_ = 0;
    pptVar13 = (token **)t_offset;
    while( true ) {
      ptVar1 = *pptVar13;
      if ((ptVar1 == (token *)0x0) || (ptVar1->length == 0)) goto LAB_0011097f;
      if (ptVar1 == ptVar8) break;
      std::__cxx11::string::append((string *)&local_a0);
      std::__cxx11::string::push_back((char)(string *)&local_a0);
      pptVar13 = &ptVar1->next;
    }
    if (local_58 < ptVar8->length) {
      std::__cxx11::string::append((string *)&local_a0,(ulong)ptVar1,0);
    }
    else {
      std::__cxx11::string::append((string *)&local_a0);
    }
LAB_0011097f:
    command_cursor::command_cursor((command_cursor *)local_130,(command_node *)ci.idx,0);
    bVar5 = true;
    ptVar1 = *(token **)t_offset;
    while ((search = ptVar1, search != (token *)0x0 &&
           (bVar4 = command_cursor::valid((command_cursor *)local_130), (bVar4 & bVar5) == 1))) {
      pdVar7 = debug::initialize(0);
      debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if (search == ptVar8) {
        bVar5 = false;
        ptVar1 = (token *)0x0;
        if (local_58 != 0) {
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)search);
          pdVar7 = debug::initialize(0);
          debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          bVar5 = command_cursor::find
                            ((command_cursor *)local_130,(string *)local_1d8,this->mask,false);
          std::__cxx11::string::~string((string *)local_1d8);
          ptVar1 = (token *)0x0;
        }
      }
      else {
        bVar5 = command_cursor::find((command_cursor *)local_130,&search->value,this->mask,false);
        if (bVar5) {
          bVar5 = command_cursor::next_root((command_cursor *)local_130);
        }
        else {
          bVar5 = false;
        }
        ptVar1 = search->next;
      }
    }
    pdVar7 = debug::initialize(0);
    debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    bVar4 = command_cursor::valid((command_cursor *)local_130);
    if (bVar4) {
      pdVar7 = debug::initialize(0);
      debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
    }
    if (bVar5 == false) {
      pdVar7 = debug::initialize(0);
      debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
      goto LAB_00111060;
    }
    local_48 = (undefined1  [8])local_48;
    options.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    options.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_48;
    pdVar7 = debug::initialize(0);
    debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
    command_cursor::command_cursor((command_cursor *)local_1d8,(command_cursor *)local_130);
    prefix.field_2._12_4_ = 0;
    while (bVar5 = command_cursor::next((command_cursor *)local_1d8), bVar5) {
      if (((cw.w._M_dataplus._M_p != (pointer)0x0) &&
          (bVar5 = command_cursor::end((command_cursor *)local_1d8), bVar5)) &&
         ((bVar5 = command_cursor::command((command_cursor *)local_1d8,this->mask,false), bVar5 ||
          (bVar5 = command_cursor::subword((command_cursor *)local_1d8,this->mask,false), bVar5))))
      {
        pdVar7 = debug::initialize(0);
        debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_48,
                    (value_type *)
                    &cw.S.c.
                     super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
        bVar5 = command_cursor::command((command_cursor *)local_1d8,this->mask,false);
        prefix.field_2._12_4_ = ZEXT14(bVar5);
      }
    }
    if (((local_48 != (undefined1  [8])local_48) &&
        (bVar5 = command_cursor::end((command_cursor *)local_130), bVar5)) &&
       ((bVar5 = command_cursor::command((command_cursor *)local_130,this->mask,false), bVar5 ||
        (bVar5 = command_cursor::subword((command_cursor *)local_130,this->mask,false), bVar5)))) {
      pdVar7 = debug::initialize(0);
      debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      __x = (value_type *)(available_str.field_2._M_local_buf + 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__x,"",(allocator<char> *)&cw.idx);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,__x);
      std::__cxx11::string::~string((string *)__x);
    }
    if (local_48 == (undefined1  [8])local_48) {
      if ((ci.w._M_dataplus._M_p == (pointer)0x0) ||
         (bVar5 = command_cursor::end((command_cursor *)local_130), !bVar5)) goto LAB_0011104b;
      pdVar7 = debug::initialize(0);
      dVar2 = debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      (*(this->super_edit_object)._vptr_edit_object[4])(SUB84(dVar2,0),this,0x20);
    }
    else {
      if (options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x1) {
        std::__cxx11::string::string
                  ((string *)(available_str.field_2._M_local_buf + 8),
                   (string *)((long)local_48 + 0x10));
        this_00 = (string *)(&available_str.field_2._M_allocated_capacity + 1);
        p_Var14 = *(_List_node_base **)local_48;
        break;
      }
      pdVar7 = debug::initialize(0);
      debug::log(pdVar7,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      auVar10 = local_48;
      p_Var14 = (_List_node_base *)((long)local_48 + 0x10);
      for (p_Var12 = (_List_node_base *)0x0;
          p_Var12 < ((_List_node_base *)((long)auVar10 + 0x10))->_M_prev;
          p_Var12 = (_List_node_base *)((long)&p_Var12->_M_next + 1)) {
        pcVar9 = (char *)std::__cxx11::string::at((ulong)p_Var14);
        (*(this->super_edit_object)._vptr_edit_object[4])(this,(ulong)(uint)(int)*pcVar9);
      }
      parse(this);
      if (prefix.field_2._12_4_ != 0) goto LAB_0011104b;
    }
    command_cursor::~command_cursor((command_cursor *)local_1d8);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48);
    command_cursor::~command_cursor((command_cursor *)local_130);
    std::__cxx11::string::~string((string *)&local_a0);
  } while( true );
LAB_00110f16:
  if (prefix._M_dataplus._M_p == (pointer)0x0) {
    putchar(10);
    auVar10 = local_48;
    while (auVar10 != (undefined1  [8])local_48) {
      pcVar11 = "";
      pcVar9 = "";
      if (((this->edit).driver)->control_enabled != false) {
        pcVar9 = "\x1b[0;36m";
        pcVar11 = "\x1b[0m";
      }
      p_Var14 = ((_List_node_base *)auVar10)->_M_next;
      printf("%s%s%s%s%s\n",pcVar11,local_a0,pcVar9,
             ((_List_node_base *)((long)auVar10 + 0x10))->_M_next,pcVar11);
      auVar10 = (undefined1  [8])p_Var14;
    }
    (this->super_edit_object).cursor = 0;
    (this->super_edit_object).prompt_rendered = 0;
LAB_00111042:
    std::__cxx11::string::~string((string *)(available_str.field_2._M_local_buf + 8));
LAB_0011104b:
    command_cursor::~command_cursor((command_cursor *)local_1d8);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48);
LAB_00111060:
    command_cursor::~command_cursor((command_cursor *)local_130);
    std::__cxx11::string::~string((string *)&local_a0);
    return;
  }
  if (p_Var14 == (_List_node_base *)local_48) {
    for (pcVar15 = (pointer)0x0; pcVar15 < prefix._M_dataplus._M_p; pcVar15 = pcVar15 + 1) {
      pcVar9 = (char *)std::__cxx11::string::at((ulong)((long)&available_str.field_2 + 8));
      (*(this->super_edit_object)._vptr_edit_object[4])(this,(ulong)(uint)(int)*pcVar9);
    }
    parse(this);
    goto LAB_00111042;
  }
  t_offset = (size_t)p_Var14->_M_next;
  p_Var12 = p_Var14 + 1;
  if (p_Var14[1]._M_prev < prefix._M_dataplus._M_p) {
    this_01 = &cw.idx;
    std::__cxx11::string::substr((ulong)this_01,(ulong)this_00);
    std::__cxx11::string::operator=(this_00,(string *)this_01);
    std::__cxx11::string::~string((string *)this_01);
  }
  while ((p_Var14 = (_List_node_base *)t_offset, prefix._M_dataplus._M_p != (pointer)0x0 &&
         (iVar6 = std::__cxx11::string::compare((ulong)p_Var12,0,(string *)prefix._M_dataplus._M_p),
         p_Var14 = (_List_node_base *)t_offset, iVar6 != 0))) {
    std::__cxx11::string::erase((ulong)this_00,(ulong)(prefix._M_dataplus._M_p + -1));
  }
  goto LAB_00110f16;
}

Assistant:

void commands::auto_complete()
    {
        LC_LOG_VERBOSE("complete@%zu/%zu",insert_idx,length());

        // only allowed at end of line + on command tokens (no quotes)
        while (insert_idx >= length()) {
            // sanity check on position in line + type of token
            size_t t_offset = 0;
            token *Tcur = find_current_token(t_offset);
            if (Tcur != NULL) {
                LC_LOG_VERBOSE("current token [%p/%s@%zu+%zu] @ %zu",Tcur,Tcur->value.c_str(),Tcur->offset,Tcur->length,t_offset);
                if (t_offset < Tcur->length || (Tcur->status & token::IS_QUOTED))
                    return;
            }
            else {
                LC_LOG_VERBOSE("** no current token **");
            }

            std::string available_str;
            token *T = t_cmd;
            while (T != NULL && T->length > 0) {
                if (T == Tcur) {
                    if (t_offset < Tcur->length) {
                        available_str.append(T->value, 0, t_offset);
                    }
                    else {
                        available_str.append(T->value);
                    }
                    break;
                }
                else {
                    available_str.append(T->value);
                    available_str += ' ';
                }
                T = T->next;
            }

            // find current position in command dictionary
            command_cursor ci(&root);
            T = t_cmd;
            bool available = true;
            while (T != NULL && ci.valid() && available) {
                LC_LOG_VERBOSE("search token [%p/%s@%zu+%zu]",T,T->value.c_str(),T->offset,T->length);
                if (T == Tcur) {
                    if (t_offset > 0) {
                        std::string v_search = T->value.substr(0,t_offset);
                        LC_LOG_VERBOSE("offset[%zu]; search for [%s]",t_offset,v_search.c_str());
                        available = ci.find(v_search,mask);
                    }
                    else {
                        available = false;
                    }
                    T = NULL;
                }
                else {
                    available = ci.find(T->value,mask);
                    available = available && ci.next_root();
                    T = T->next;
                }
            }

            LC_LOG_DEBUG("cursor: %p @ %zu: [%s]", ci.current(), ci.current_idx(), ci.word().c_str());
            if (ci.valid())
                LC_LOG_VERBOSE("dictionary option: [%s]",ci.current()->part.c_str());

            if (!available) {
                LC_LOG_DEBUG("** no options available **");
                return;
            }

            // collect combinations (full words + words with sub-words + words with valid commands)
            typedef std::list<std::string> string_list_t;
            string_list_t options;
            bool is_command = false;
            LC_LOG_VERBOSE("current partial word: [%s]",ci.word().c_str());
            command_cursor cw(ci);
            while (cw.next()) {
                if (!cw.word().empty() && cw.end() && (cw.command(mask) || cw.subword(mask))) {
                    LC_LOG_VERBOSE("options += %s[%s]", ci.word().c_str(), cw.word().c_str());
                    options.push_back(cw.word());
                    is_command = cw.command(mask);
                }
            }
            if (!options.empty() && ci.end() && (ci.command(mask) || ci.subword(mask))) {
                LC_LOG_VERBOSE("options += <cr>");
                options.push_back("");
            }

            if (options.empty()) {
                if (!ci.word().empty() && ci.end()) {
                    // end-of-word --> add space
                    LC_LOG_DEBUG("insert space");
                    insert(' ');
                    // no need to reparse because whitespace does not change token list
                }
                else {
                    return;
                }
            }
            else if (options.size() == 1) {
                // middle-of-word --> complete word (take first option)
                // line empty / after whitespace + 1 path --> add word
                LC_LOG_DEBUG("insert(middle/empty) [%s]",options.front().c_str());
                const std::string &word_to_insert = options.front();
                size_t i = 0;
                while (i < word_to_insert.size())
                    insert(word_to_insert.at(i++));
                // reparse before next iteration of loop
                parse();
                // stop auto-complete if new string is a valid command
                if (is_command)
                    return;
            }
            else {
                // 2+ options --> find longest common prefix amongst options
                std::string prefix = options.front();
                string_list_t::const_iterator si = options.begin();
                ++si;
                while (!prefix.empty() && si != options.end()) {
                    const std::string &cmp_str = *si++;
                    if (cmp_str.length() < prefix.length())
                        prefix = prefix.substr(0,cmp_str.length());
                    while (!prefix.empty() && cmp_str.compare(0,prefix.length(),prefix) != 0)
                        prefix.erase(prefix.length() - 1);
                }

                if (!prefix.empty()) {
                    // common prefix available --> add prefix
                    size_t i = 0;
                    while (i < prefix.size())
                        insert(prefix.at(i++));
                    // reparse before next iteration of loop
                    parse();
                }
                else {
                    // dump available options
                    printf("\n");
                    string_list_t::const_iterator si = options.begin();
                    while (si != options.end()) {
                        printf("%s%s%s%s%s\n",
                            color_str(COLOR_NORMAL),
                            available_str.c_str(),
                            color_str(COLOR_COMPLETION),
                            (si++)->c_str(),
                            color_str(COLOR_NORMAL));
                    }
                    rewind();
                }
                return;
            }
        }
    }